

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

QSize __thiscall
QPixmapStyle::sizeFromContents
          (QPixmapStyle *this,ContentsType type,QStyleOption *option,QSize *contentsSize,
          QWidget *widget)

{
  QSize QVar1;
  QWidget *in_RDX;
  undefined4 in_ESI;
  QStyleOption *in_RDI;
  QWidget *unaff_retaddr;
  QStyleOption *in_stack_00000008;
  QStyleOption *in_stack_00000010;
  undefined4 in_stack_00000030;
  QWidget *in_stack_000000f0;
  QSize *in_stack_000000f8;
  QStyleOption *in_stack_00000100;
  ContentsType in_stack_0000010c;
  QCommonStyle *in_stack_00000110;
  undefined4 in_stack_ffffffffffffffe8;
  QStyleOption *in_stack_fffffffffffffff8;
  
  switch(in_ESI) {
  case 0:
    QVar1 = pushButtonSizeFromContents
                      ((QPixmapStyle *)in_stack_00000010,in_stack_00000008,(QSize *)unaff_retaddr,
                       (QWidget *)in_stack_fffffffffffffff8);
    break;
  default:
    QVar1 = QCommonStyle::sizeFromContents
                      (in_stack_00000110,in_stack_0000010c,in_stack_00000100,in_stack_000000f8,
                       in_stack_000000f0);
    break;
  case 4:
    QVar1 = comboBoxSizeFromContents
                      ((QPixmapStyle *)widget,in_stack_00000010,(QSize *)in_stack_00000008,
                       unaff_retaddr);
    break;
  case 6:
    QVar1 = progressBarSizeFromContents
                      ((QPixmapStyle *)unaff_retaddr,in_stack_fffffffffffffff8,(QSize *)in_RDI,
                       (QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    break;
  case 0xc:
    QVar1 = sliderSizeFromContents
                      ((QPixmapStyle *)in_stack_fffffffffffffff8,in_RDI,
                       (QSize *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
    break;
  case 0xe:
    QVar1 = lineEditSizeFromContents
                      ((QPixmapStyle *)in_stack_00000010,in_stack_00000008,(QSize *)unaff_retaddr,
                       (QWidget *)in_stack_fffffffffffffff8);
    break;
  case 0x16:
    QVar1 = itemViewSizeFromContents
                      ((QPixmapStyle *)CONCAT44(type,in_stack_00000030),option,contentsSize,widget);
  }
  return QVar1;
}

Assistant:

QSize QPixmapStyle::sizeFromContents(ContentsType type, const QStyleOption *option,
                                     const QSize &contentsSize, const QWidget *widget) const
{
    switch (type) {
    case CT_PushButton:
        return pushButtonSizeFromContents(option, contentsSize, widget);
    case CT_LineEdit:
        return lineEditSizeFromContents(option, contentsSize, widget);
    case CT_ProgressBar:
        return progressBarSizeFromContents(option, contentsSize, widget);
    case CT_Slider:
        return sliderSizeFromContents(option, contentsSize, widget);
    case CT_ComboBox:
        return comboBoxSizeFromContents(option, contentsSize, widget);
    case CT_ItemViewItem:
        return itemViewSizeFromContents(option, contentsSize, widget);
    default: ;
    }

    return QCommonStyle::sizeFromContents(type, option, contentsSize, widget);
}